

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

bool_t ecpCreateJ(ec_o *ec,qr_o *f,octet *A,octet *B,void *stack)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  bool_t bVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  code *pcVar12;
  bool_t bVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  iVar5 = wwCmpW(f->mod,f->n,3);
  bVar13 = 0;
  if (0 < iVar5) {
    memSet(ec,'\0',0xb0);
    ec->d = 3;
    ec->f = f;
    ec->A = (word *)(ec + 1);
    ec->B = &ec[1].hdr.keep + f->n;
    bVar6 = (*f->from)((word *)(ec + 1),A,f,stack);
    bVar13 = 0;
    if (bVar6 != 0) {
      bVar6 = (*ec->f->from)(ec->B,B,ec->f,stack);
      if (bVar6 != 0) {
        zzDoubleMod((word *)stack,f->unity,f->mod,f->n);
        zzAddMod((word *)stack,(word *)stack,f->unity,f->mod,f->n);
        zzNegMod((word *)stack,(word *)stack,f->mod,f->n);
        iVar5 = wwCmp((word *)stack,ec->A,f->n);
        sVar11 = f->n;
        ec->base = ec->B + sVar11;
        ec->order = ec->B + sVar11 + f->n * 2;
        ec->froma = ecpFromAJ;
        ec->toa = ecpToAJ;
        ec->neg = ecpNegJ;
        ec->add = ecpAddJ;
        ec->adda = ecpAddAJ;
        ec->sub = ecpSubJ;
        ec->suba = ecpSubAJ;
        pcVar12 = ecpDblJ;
        if (iVar5 == 0) {
          pcVar12 = ecpDblJA3;
        }
        ec->dbl = pcVar12;
        ec->dbla = ecpDblAJ;
        pcVar12 = ecpTplJ;
        if (iVar5 == 0) {
          pcVar12 = ecpTplJA3;
        }
        ec->tpl = pcVar12;
        sVar11 = f->n;
        lVar16 = sVar11 * 0x10 + f->deep;
        sVar7 = utilMax(2,f->deep,lVar16);
        lVar14 = f->n * 0x20;
        sVar8 = utilMax(2,f->deep,f->deep + lVar14);
        sVar1 = f->n;
        sVar9 = utilMax(2,f->deep,sVar1 * 0x10 + f->deep);
        sVar2 = f->n;
        sVar10 = utilMax(2,f->deep,sVar2 * 0x20 + f->deep);
        sVar3 = f->n;
        sVar4 = f->deep;
        lVar15 = sVar3 * 0x38;
        if (iVar5 != 0) {
          lVar15 = sVar3 << 6;
        }
        sVar11 = utilMax(8,lVar16,sVar11 * 0x20 + sVar7,sVar8 + lVar14,sVar1 * 0x38 + sVar9,
                         sVar2 * 0x30 + sVar10,sVar3 * 0x10 + sVar4,sVar3 * 0x20 + sVar4,
                         lVar15 + sVar4);
        ec->deep = sVar11;
        (ec->hdr).keep = f->n * 0x28 + 0xb8;
        (ec->hdr).p_count = 6;
        (ec->hdr).o_count = 1;
        bVar13 = 1;
      }
    }
  }
  return bVar13;
}

Assistant:

bool_t ecpCreateJ(ec_o* ec, const qr_o* f, const octet A[], const octet B[], 
	void* stack)
{
	register bool_t bA3;
	word* t;
	// pre
	ASSERT(memIsValid(ec, sizeof(ec_o)));
	ASSERT(gfpIsOperable(f));
	ASSERT(memIsValid(A, f->no)); 
	ASSERT(memIsValid(B, f->no));
	// f->mod > 3?
	if (wwCmpW(f->mod, f->n, 3) <= 0)
		return FALSE;
	// обнулить
	memSetZero(ec, sizeof(ec_o));
	// зафикисровать размерности
	ec->d = 3;
	// запомнить базовое поле
	ec->f = f;
	// сохранить коэффициенты
	ec->A = (word*)ec->descr;
	ec->B = ec->A + f->n;
	if (!qrFrom(ec->A, A, ec->f, stack) || !qrFrom(ec->B, B, ec->f, stack))
		return FALSE;
	// t <- -3
	t = (word*)stack;
	gfpDouble(t, f->unity, f);
	zmAdd(t, t, f->unity, f);
	zmNeg(t, t, f);
	// bA3 <- A == -3?
	bA3 = qrCmp(t, ec->A, f) == 0;
	// подготовить буферы для описания группы точек
	ec->base = ec->B + f->n;
	ec->order = ec->base + 2 * f->n;
	// настроить интерфейсы
	ec->froma = ecpFromAJ;
	ec->toa = ecpToAJ;
	ec->neg = ecpNegJ;
	ec->add = ecpAddJ;
	ec->adda = ecpAddAJ;
	ec->sub = ecpSubJ;
	ec->suba = ecpSubAJ;
	ec->dbl = bA3 ? ecpDblJA3 : ecpDblJ;
	ec->dbla = ecpDblAJ;
	ec->tpl = bA3 ? ecpTplJA3 : ecpTplJ;
	ec->deep = utilMax(8,
		ecpToAJ_deep(f->n, f->deep),
		ecpAddJ_deep(f->n, f->deep),
		ecpAddAJ_deep(f->n, f->deep),
		ecpSubJ_deep(f->n, f->deep),
		ecpSubAJ_deep(f->n, f->deep),
		bA3 ? ecpDblJA3_deep(f->n, f->deep) : ecpDblJ_deep(f->n, f->deep),
		ecpDblAJ_deep(f->n, f->deep),
		bA3 ? ecpTplJA3_deep(f->n, f->deep) : ecpTplJ_deep(f->n, f->deep));
	// настроить
	ec->hdr.keep = sizeof(ec_o) + O_OF_W(5 * f->n + 1);
	ec->hdr.p_count = 6;
	ec->hdr.o_count = 1;
	// все нормально
	bA3 = 0;
	return TRUE;
}